

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O2

BN * CTO(BN *__return_storage_ptr__,vector<BN,_std::allocator<BN>_> *m,
        vector<BN,_std::allocator<BN>_> *v)

{
  BN *bn;
  pointer pBVar1;
  long lVar2;
  ulong uVar3;
  invalid_argument *this;
  long lVar4;
  int iVar5;
  ulong uVar6;
  BN x;
  BN M;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_f0;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_d8;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_c0;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_a8;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_90;
  BN Mi;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  bn = (m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.super__Vector_impl_data.
                _M_finish - (long)bn;
  if (lVar2 == (long)(v->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(v->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    lVar4 = 0x18;
    uVar3 = lVar2 / 0x18;
    BN::BN(&M,bn);
    iVar5 = (int)uVar3;
    for (lVar2 = 1; lVar2 < iVar5; lVar2 = lVar2 + 1) {
      BN::operator*(&x,&M,(BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                          super__Vector_impl_data._M_start)->ba).
                                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                        ._M_impl + lVar4));
      BN::operator=(&M,&x);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&x);
      lVar4 = lVar4 + 0x18;
    }
    BN::bn0();
    uVar6 = 0;
    uVar3 = uVar3 & 0xffffffff;
    if (iVar5 < 1) {
      uVar3 = uVar6;
    }
    for (; uVar3 * 0x18 != uVar6; uVar6 = uVar6 + 0x18) {
      BN::operator/(&Mi,&M,(BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                           super__Vector_impl_data._M_start)->ba).
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl + uVar6));
      pBVar1 = (v->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      BN::operator/((BN *)&local_90,&M,
                    (BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                    super__Vector_impl_data._M_start)->ba).
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl + uVar6));
      BN::operator*((BN *)&local_d8,
                    (BN *)((long)&(pBVar1->ba).
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl + uVar6),(BN *)&local_90);
      BN::operator/((BN *)&local_f0,&M,
                    (BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                                    super__Vector_impl_data._M_start)->ba).
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl + uVar6));
      BN::BN((BN *)&local_c0,
             (BN *)((long)&(((m->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
                             super__Vector_impl_data._M_start)->ba).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl + uVar6));
      gcdInverseEuclideanBinary((BN *)&local_a8,(BN *)&local_f0,(BN *)&local_c0);
      BN::operator*((BN *)&local_60,(BN *)&local_d8,(BN *)&local_a8);
      BN::operator%((BN *)&local_48,(BN *)&local_60,&M);
      BN::operator+=(&x,(BN *)&local_48);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_a8);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_c0);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_f0);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_d8);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_90);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&Mi);
    }
    BN::operator%(__return_storage_ptr__,&x,&M);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&x);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&M);
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"CTO: Sizes of arrays are different");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BN CTO(const std::vector <BN>& m, const std::vector <BN>& v)
{
    if(m.size()!=v.size())
        throw invalid_argument("CTO: Sizes of arrays are different");

    int t = m.size();
    BN M = m[0];
    for (int i=1;i<t;i++)
        M = M * m[i];
    BN x(BN::bn0());
    for (int i=0;i<t;i++)
    {
        BN Mi = M/m[i];
        x += v[i] * (M/m[i]) * gcdInverseEuclideanBinary(M/m[i],m[i]) % M;
    }
    return x % M;
}